

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O2

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo),_boost::python::default_call_policies,_boost::mpl::vector5<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo>_>
::operator()(impl<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo),_boost::python::default_call_policies,_boost::mpl::vector5<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyObject *pPVar1;
  c_t0 c0;
  c_t2 c2;
  c_t3 c3;
  c_t1 c1;
  PyTypeObject *local_158;
  undefined4 local_14c;
  arg_rvalue_from_python<int> local_148;
  arg_rvalue_from_python<HFParsingInfo> local_128;
  arg_rvalue_from_python<HighFreqDataType> local_c8;
  
  local_158 = args_[1].ob_type;
  converter::arg_rvalue_from_python<HighFreqDataType>::arg_rvalue_from_python
            (&local_c8,(PyObject *)args_[2].ob_refcnt);
  if ((undefined1 *)
      local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.stage1.convertible ==
      (undefined1 *)0x0) {
    pPVar1 = (PyObject *)0x0;
  }
  else {
    converter::arg_rvalue_from_python<int>::arg_rvalue_from_python
              (&local_148,(PyObject *)args_[2].ob_type);
    if (local_148.m_data.super_rvalue_from_python_storage<int_&>.stage1.convertible == (void *)0x0)
    {
      pPVar1 = (PyObject *)0x0;
    }
    else {
      converter::arg_rvalue_from_python<HFParsingInfo>::arg_rvalue_from_python
                (&local_128,(PyObject *)args_[3].ob_refcnt);
      if (local_128.m_data.super_rvalue_from_python_storage<HFParsingInfo_&>.stage1.convertible ==
          (void *)0x0) {
        pPVar1 = (PyObject *)0x0;
      }
      else {
        local_14c = 0;
        pPVar1 = invoke<int,void(*)(_object*,HighFreqDataType,int,HFParsingInfo),boost::python::arg_from_python<_object*>,boost::python::arg_from_python<HighFreqDataType>,boost::python::arg_from_python<int>,boost::python::arg_from_python<HFParsingInfo>>
                           (&local_14c,this,&local_158,&local_c8,&local_148,&local_128);
      }
      converter::rvalue_from_python_data<HFParsingInfo_&>::~rvalue_from_python_data
                (&local_128.m_data);
    }
    if ((type *)local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.stage1.
                convertible ==
        &local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.storage) {
      (**local_c8.m_data.super_rvalue_from_python_storage<HighFreqDataType_&>.storage.t7)();
    }
  }
  return pPVar1;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }